

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void ypr_text_squote_line(lys_ypr_ctx *pctx,char *text,int text_len)

{
  char *pcVar1;
  bool bVar2;
  uint local_54;
  uint local_34;
  char *pcStack_30;
  int squote_len;
  char *squote;
  char *end;
  char *pcStack_18;
  int text_len_local;
  char *text_local;
  lys_ypr_ctx *pctx_local;
  
  pcVar1 = text + text_len;
  pcStack_18 = text;
  while( true ) {
    bVar2 = false;
    if (pcStack_18 != pcVar1) {
      pcStack_30 = ly_strnchr(pcStack_18,0x27,(long)pcVar1 - (long)pcStack_18);
      bVar2 = pcStack_30 != (char *)0x0;
    }
    if (!bVar2) break;
    ly_print_((pctx->field_0).field_0.out,"%.*s",(ulong)(uint)((int)pcStack_30 - (int)pcStack_18),
              pcStack_18);
    local_34 = 0;
    do {
      local_34 = local_34 + 1;
      bVar2 = false;
      if (pcStack_30 + (int)local_34 != pcVar1) {
        bVar2 = pcStack_30[(int)local_34] == '\'';
      }
    } while (bVar2);
    if (((pctx->field_0).field_0.options & 2) == 0) {
      local_54 = (uint)(pctx->field_0).field_0.level << 1;
    }
    else {
      local_54 = 0;
    }
    ly_print_((pctx->field_0).field_0.out,"\' + \"%.*s\" +\n%*s\'",(ulong)local_34,pcStack_30,
              (ulong)local_54,"");
    pcStack_18 = pcStack_30 + (int)local_34;
  }
  ly_print_((pctx->field_0).field_0.out,"%.*s",(ulong)(uint)((int)pcVar1 - (int)pcStack_18),
            pcStack_18);
  return;
}

Assistant:

static void
ypr_text_squote_line(struct lys_ypr_ctx *pctx, const char *text, int text_len)
{
    const char *end = text + text_len, *squote;
    int squote_len;

    while ((text != end) && (squote = ly_strnchr(text, '\'', end - text))) {
        /* before squote */
        ly_print_(pctx->out, "%.*s", (int)(squote - text), text);

        /* specially-encoded squote(s) */
        squote_len = 0;
        do {
            ++squote_len;
        } while ((squote + squote_len != end) && (squote[squote_len] == '\''));
        ly_print_(pctx->out, "' + \"%.*s\" +\n%*s'", squote_len, squote, INDENT);

        /* next iter */
        text = squote + squote_len;
    }

    ly_print_(pctx->out, "%.*s", (int)(end - text), text);
}